

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DFlicker::DFlicker(DFlicker *this,sector_t *sector,int upper,int lower)

{
  short sVar1;
  uint uVar2;
  int lower_local;
  int upper_local;
  sector_t *sector_local;
  DFlicker *this_local;
  
  DLighting::DLighting(&this->super_DLighting,sector);
  (this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b6d108;
  sVar1 = sector_t::ClampLight(upper);
  this->m_MaxLight = (int)sVar1;
  sVar1 = sector_t::ClampLight(lower);
  this->m_MinLight = (int)sVar1;
  sector->lightlevel = (short)this->m_MaxLight;
  uVar2 = FRandom::operator()(&pr_flicker);
  this->m_Count = (uVar2 & 0x40) + 1;
  return;
}

Assistant:

DFlicker::DFlicker (sector_t *sector, int upper, int lower)
	: DLighting (sector)
{
	m_MaxLight = sector_t::ClampLight(upper);
	m_MinLight = sector_t::ClampLight(lower);
	sector->lightlevel = m_MaxLight;
	m_Count = (pr_flicker()&64)+1;
}